

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O2

void Pdr_ManPrintCex(Aig_Man_t *pAig,Vec_Int_t *vCiObjs,Vec_Int_t *vCiVals,Vec_Int_t *vCi2Rem)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  void *__ptr;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  Aig_Obj_t *pObj;
  
  uVar1 = pAig->nObjs[2];
  pObj = (Aig_Obj_t *)((long)(int)uVar1 + 1);
  __ptr = malloc((size_t)pObj);
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    *(undefined1 *)((long)__ptr + uVar4) = 0x2d;
  }
  *(undefined1 *)((long)__ptr + uVar5) = 0;
  for (iVar6 = 0; iVar2 = (int)pObj, iVar6 < vCiObjs->nSize; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(vCiObjs,iVar6);
    pObj = Aig_ManObj(pAig,iVar2);
    iVar2 = Vec_IntEntry(vCiVals,iVar6);
    iVar3 = Aig_ObjCioId(pObj);
    *(byte *)((long)__ptr + (long)iVar3) = iVar2 == 0 ^ 0x31;
  }
  if (vCi2Rem != (Vec_Int_t *)0x0) {
    for (iVar6 = 0; iVar2 = (int)pObj, iVar6 < vCi2Rem->nSize; iVar6 = iVar6 + 1) {
      iVar2 = Vec_IntEntry(vCi2Rem,iVar6);
      pObj = Aig_ManObj(pAig,iVar2);
      iVar2 = Aig_ObjCioId(pObj);
      *(undefined1 *)((long)__ptr + (long)iVar2) = 0x78;
    }
  }
  Abc_Print(iVar2,"%s\n",__ptr);
  free(__ptr);
  return;
}

Assistant:

void Pdr_ManPrintCex( Aig_Man_t * pAig, Vec_Int_t * vCiObjs, Vec_Int_t * vCiVals, Vec_Int_t * vCi2Rem )
{
    Aig_Obj_t * pObj;
    int i;
    char * pBuff = ABC_ALLOC( char, Aig_ManCiNum(pAig)+1 );
    for ( i = 0; i < Aig_ManCiNum(pAig); i++ )
        pBuff[i] = '-';
    pBuff[i] = 0;
    Aig_ManForEachObjVec( vCiObjs, pAig, pObj, i )
        pBuff[Aig_ObjCioId(pObj)] = (Vec_IntEntry(vCiVals, i)? '1':'0');
    if ( vCi2Rem )
    Aig_ManForEachObjVec( vCi2Rem, pAig, pObj, i )
        pBuff[Aig_ObjCioId(pObj)] = 'x';
    Abc_Print( 1, "%s\n", pBuff );
    ABC_FREE( pBuff );
}